

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  void **ppvVar1;
  MessageLite *pMVar2;
  Arena *pAVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  Rep *pRVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  
  if (this->is_repeated == true) {
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4)) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      ((this->field_0).repeated_int32_value)->current_size_ = 0;
      break;
    case 9:
      pRVar4 = (this->field_0).repeated_string_value;
      lVar8 = (long)(pRVar4->super_RepeatedPtrFieldBase).current_size_;
      if (0 < lVar8) {
        pRVar5 = (pRVar4->super_RepeatedPtrFieldBase).rep_;
        lVar7 = 0;
        do {
          puVar6 = (undefined8 *)pRVar5->elements[lVar7];
          lVar7 = lVar7 + 1;
          puVar6[1] = 0;
          *(undefined1 *)*puVar6 = 0;
        } while (lVar8 != lVar7);
        (pRVar4->super_RepeatedPtrFieldBase).current_size_ = 0;
      }
      break;
    case 10:
      pRVar4 = (this->field_0).repeated_string_value;
      lVar8 = (long)(pRVar4->super_RepeatedPtrFieldBase).current_size_;
      if (0 < lVar8) {
        pRVar5 = (pRVar4->super_RepeatedPtrFieldBase).rep_;
        lVar7 = 0;
        do {
          ppvVar1 = pRVar5->elements + lVar7;
          lVar7 = lVar7 + 1;
          (**(code **)(**ppvVar1 + 0x38))();
        } while (lVar8 != lVar7);
        (pRVar4->super_RepeatedPtrFieldBase).current_size_ = 0;
      }
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 10) {
      pAVar3 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        (**(code **)(pAVar3 + 0x38))();
      }
      else {
        (**(code **)(pAVar3 + 0x70))();
      }
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 9) {
      pMVar2 = (this->field_0).message_value;
      pMVar2[1]._vptr_MessageLite = (_func_int **)0x0;
      *(undefined1 *)pMVar2->_vptr_MessageLite = 0;
    }
    this->field_0xa = (this->field_0xa & 0xf0) + 1;
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    repeated_##LOWERCASE##_value->Clear();  \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            lazymessage_value->Clear();
          } else {
            message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}